

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O1

void __thiscall
iu_MatcherFailure_x_iutest_x_ContainsRegex_Test::Body
          (iu_MatcherFailure_x_iutest_x_ContainsRegex_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestFlag *pTVar2;
  Variable *pVVar3;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  size_type __dnew;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  allocator<char> local_2ad;
  TestFlag local_2ac;
  string local_2a8;
  undefined1 *local_288 [2];
  _AutomatonPtr local_278;
  _Alloc_hider local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  string local_248;
  AssertionResult local_228;
  AssertionResult local_200;
  SPIFailureChecker local_1d8;
  undefined1 local_1a0 [8];
  undefined1 local_198 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  bool local_158;
  ios_base local_120 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_1d8.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_1d8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f038;
  local_1d8.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2ac);
  paVar1 = &local_2a8.field_2;
  local_2a8.field_2._M_allocated_capacity._0_4_ = 0x392d305b;
  local_2a8.field_2._M_allocated_capacity._4_2_ = 0x5d;
  local_2a8._M_string_length = 5;
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  iutest::detail::iuRegex::iuRegex((iuRegex *)local_288,&local_2a8);
  local_1a0 = (undefined1  [8])&PTR__RegexMatcher_0023fb50;
  iutest::detail::iuRegex::iuRegex((iuRegex *)local_198,(iuRegex *)local_288);
  local_158 = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&((iuRegex *)local_288)->m_pattern + 0x10U)) {
    operator_delete(local_268._M_p,local_258._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_288);
  iutest::detail::RegexMatcher::operator()
            (&local_200,(RegexMatcher *)local_1a0,(char (*) [5])0x208472);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_p != &local_168) {
    operator_delete(local_178._M_p,local_168._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT26(local_2a8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2a8.field_2._M_allocated_capacity._4_2_,
                                      local_2a8.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if (local_200.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::PrintToString<char[5]>(&local_248,(char (*) [5])0x208472);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_2a8,(detail *)local_248._M_dataplus._M_p,"ContainsRegex(\"[0-9]\")",
               (char *)&local_200,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_288,local_2a8._M_dataplus._M_p,&local_2ad);
    local_268._M_p =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_260 = 0x200000326;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_288,(Fixed *)local_1a0,false);
    if ((_AutomatonPtr *)local_288[0] !=
        (_AutomatonPtr *)((long)&((iuRegex *)local_288)->m_re + 0x10U)) {
      operator_delete(local_288[0],
                      (ulong)((long)&(local_278.
                                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->super__NFA_base + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p,
                      CONCAT26(local_2a8.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_2a8.field_2._M_allocated_capacity._4_2_,
                                        local_2a8.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = local_2ac.m_test_flags;
  local_288[0] = (undefined1 *)0x14;
  local_1a0 = (undefined1  [8])(local_198 + 8);
  local_1a0 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_1a0,(ulong)local_288);
  local_190._M_allocated_capacity = (size_type)local_288[0];
  *(undefined8 *)local_1a0 = 0x736e6961746e6f43;
  *(undefined8 *)((long)local_1a0 + 8) = 0x5b203a7865676552;
  *(undefined4 *)((long)local_1a0 + 0x10) = 0x5d392d30;
  local_198 = (undefined1  [8])local_288[0];
  *(char *)((long)local_1a0 + (long)local_288[0]) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_228,&local_1d8,(string *)local_1a0);
  if (local_1a0 != (undefined1  [8])(local_198 + 8)) {
    operator_delete((void *)local_1a0,(ulong)(local_190._M_allocated_capacity + 1));
  }
  local_1d8.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f0b8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_1d8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  local_1d8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023f0e0;
  pVVar3 = iutest::TestEnv::get_vars();
  pVVar3->m_testpartresult_reporter =
       local_1d8.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  if (local_228.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_288,local_228.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1d8);
    local_268._M_p =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_260 = 0x100000327;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_288,(Fixed *)local_1a0,false);
    if ((_AutomatonPtr *)local_288[0] !=
        (_AutomatonPtr *)((long)&((iuRegex *)local_288)->m_re + 0x10U)) {
      operator_delete(local_288[0],
                      (ulong)((long)&(local_278.
                                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->super__NFA_base + 1));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.m_message._M_dataplus._M_p != &local_228.m_message.field_2) {
    operator_delete(local_228.m_message._M_dataplus._M_p,
                    local_228.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(MatcherFailure, ContainsRegex)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT("hoge", ContainsRegex("[0-9]"))
        , "ContainsRegex: [0-9]");
}